

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

Script * __thiscall
cfd::core::AbstractTransaction::SetUnlockingScript
          (Script *__return_storage_ptr__,AbstractTransaction *this,uint32_t tx_in_index,
          vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *unlocking_script)

{
  pointer this_00;
  bool bVar1;
  ByteData *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  Script local_c0;
  undefined1 local_78 [8];
  ByteData script;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *__range2;
  ScriptBuilder builder;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *unlocking_script_local;
  uint32_t tx_in_index_local;
  AbstractTransaction *this_local;
  
  builder.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)unlocking_script;
  (*this->_vptr_AbstractTransaction[0xb])(this,(ulong)tx_in_index,0x1a6,"SetUnlockingScript");
  ScriptBuilder::ScriptBuilder((ScriptBuilder *)0x430da4);
  this_00 = builder.script_byte_array_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  __end2 = ::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::begin
                     ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                      builder.script_byte_array_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  script.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)::std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::end
                          ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                           this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
                                *)&script.data_.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
    ::operator*(&__end2);
    ByteData::ByteData((ByteData *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                       in_stack_ffffffffffffff18);
    ScriptBuilder::AppendData((ScriptBuilder *)&__range2,(ByteData *)local_78);
    ByteData::~ByteData((ByteData *)0x430e08);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::ByteData_*,_std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>_>
    ::operator++(&__end2);
  }
  ScriptBuilder::Build(&local_c0,(ScriptBuilder *)&__range2);
  SetUnlockingScript(this,tx_in_index,&local_c0);
  Script::~Script((Script *)CONCAT44(tx_in_index,in_stack_ffffffffffffff20));
  ScriptBuilder::Build(__return_storage_ptr__,(ScriptBuilder *)&__range2);
  ScriptBuilder::~ScriptBuilder((ScriptBuilder *)0x430e9b);
  return __return_storage_ptr__;
}

Assistant:

Script AbstractTransaction::SetUnlockingScript(
    uint32_t tx_in_index, const std::vector<ByteData> &unlocking_script) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  ScriptBuilder builder;
  for (ByteData script : unlocking_script) {
    builder.AppendData(script);
  }
  SetUnlockingScript(tx_in_index, builder.Build());
  return builder.Build();
}